

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O0

ostream * operator<<(ostream *os,SequenceDistanceGraph *sdg)

{
  bool bVar1;
  reference __src;
  long lVar2;
  ostream *poVar3;
  size_t sVar4;
  vector<Link,_std::allocator<Link>_> *pvVar5;
  long in_RSI;
  ostream *in_RDI;
  Link l;
  iterator __end2;
  iterator __begin2;
  vector<Link,_std::allocator<Link>_> *__range2;
  vector<Link,_std::allocator<Link>_> lv;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *__range1;
  uint64_t linkcount;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff68;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *in_stack_ffffffffffffff70;
  long local_88;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff80;
  SequenceDistanceGraph *in_stack_ffffffffffffff90;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_58;
  undefined1 *local_50;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffffb8;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::vector<Link,_std::allocator<Link>_>_*,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
  local_28;
  long local_20;
  ulong local_18;
  long local_10;
  ostream *local_8;
  
  local_18 = 0;
  local_20 = in_RSI + 8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28._M_current =
       (vector<Link,_std::allocator<Link>_> *)
       std::
       vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
       ::begin((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                *)in_stack_ffffffffffffff68);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::end((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
         *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<Link,_std::allocator<Link>_>_*,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_std::vector<Link,_std::allocator<Link>_>_*,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::vector<Link,_std::allocator<Link>_>_*,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
    ::operator*(&local_28);
    std::vector<Link,_std::allocator<Link>_>::vector
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_50 = &stack0xffffffffffffffb8;
    local_58._M_current =
         (Link *)std::vector<Link,_std::allocator<Link>_>::begin(in_stack_ffffffffffffff68);
    std::vector<Link,_std::allocator<Link>_>::end(in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff70,
                         (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
                         in_stack_ffffffffffffff68);
      if (!bVar1) break;
      __src = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
              operator*(&local_58);
      memcpy(&local_88,__src,0x28);
      lVar2 = local_88;
      if (local_88 < 1) {
        lVar2 = -local_88;
      }
      pvVar5 = in_stack_ffffffffffffff80;
      if ((long)in_stack_ffffffffffffff80 < 1) {
        pvVar5 = (vector<Link,_std::allocator<Link>_> *)-(long)in_stack_ffffffffffffff80;
      }
      if (lVar2 <= (long)pvVar5) {
        local_18 = local_18 + 1;
      }
      __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
                (&local_58);
    }
    std::vector<Link,_std::allocator<Link>_>::~vector(in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<const_std::vector<Link,_std::allocator<Link>_>_*,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
    ::operator++(&local_28);
  }
  poVar3 = std::operator<<(local_8,"SequenceDistanceGraph ");
  poVar3 = std::operator<<(poVar3,(string *)(local_10 + 0x20));
  poVar3 = std::operator<<(poVar3,": ");
  sVar4 = SequenceDistanceGraph::count_active_nodes(in_stack_ffffffffffffff90);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," nodes, ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  std::operator<<(poVar3," links");
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraph &sdg) {
    uint64_t linkcount = 0;
    for (auto lv:sdg.links)
        for (auto l:lv)
            if (llabs(l.source) <= llabs(l.dest)) ++linkcount;

    os <<"SequenceDistanceGraph " << sdg.name <<": "<< sdg.count_active_nodes() <<" nodes, " << linkcount << " links";
    return os;
}